

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O2

BBox * __thiscall CMU462::Face::bounds(BBox *__return_storage_ptr__,Face *this)

{
  _List_node_base *p_Var1;
  
  BBox::BBox(__return_storage_ptr__);
  p_Var1 = (this->_halfedge)._M_node;
  do {
    BBox::expand(__return_storage_ptr__,(Vector3D *)&p_Var1[2]._M_prev[1]._M_prev);
    p_Var1 = p_Var1[2]._M_next;
  } while (p_Var1 != (this->_halfedge)._M_node);
  return __return_storage_ptr__;
}

Assistant:

BBox Face::bounds() const {
  BBox box;

  // grow the bounding box to contain
  // all vertices contained in this face
  HalfedgeCIter h = halfedge();
  do {
    box.expand(h->vertex()->position);
    h = h->next();
  } while (h != halfedge());

  return box;
}